

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O2

void __thiscall
QSslConfiguration::setAllowedNextProtocols(QSslConfiguration *this,QList<QByteArray> *protocols)

{
  QSslConfigurationPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QSslConfigurationPrivate>::operator->(&this->d);
  QArrayDataPointer<QByteArray>::operator=(&(pQVar1->nextAllowedProtocols).d,&protocols->d);
  return;
}

Assistant:

void QSslConfiguration::setAllowedNextProtocols(const QList<QByteArray> &protocols)
{
    d->nextAllowedProtocols = protocols;
}